

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream ss;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98 [8];
  string make;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string generator;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *buildCommand;
  
  generator.field_2._8_8_ = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_GENERATOR",&local_61);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_40,pcVar2,(allocator *)(make.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(make.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = generator.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"CMAKE_MAKE_PROGRAM",&local_b9);
  pcVar2 = cmMakefile::GetRequiredDefinition((cmMakefile *)this_00,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar2,&local_ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"NMake Makefiles");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"Ninja"), bVar1)) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_98);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"MinGW Makefiles");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"Unix Makefiles"), bVar1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      poVar3 = std::operator<<((ostream *)local_238,local_98);
      poVar3 = std::operator<<(poVar3," -j ");
      std::ostream::operator<<(poVar3,this->CpuCount);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_258);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    }
  }
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetBuildCommand(const cmMakefile* mf) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  if ( generator == "NMake Makefiles" ||
       generator == "Ninja" )
    {
    buildCommand = make;
    }
  else if ( generator == "MinGW Makefiles" ||
            generator == "Unix Makefiles" )
    {
    std::ostringstream ss;
    ss << make << " -j " << this->CpuCount;
    buildCommand = ss.str();
    }
  return buildCommand;
}